

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O2

void init_scaling_function(int (*scaling_points) [2],int num_points,int *scaling_lut)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int i;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (num_points != 0) {
    for (lVar4 = 0; lVar4 < (*scaling_points)[0]; lVar4 = lVar4 + 1) {
      scaling_lut[lVar4] = (*scaling_points)[1];
    }
    uVar7 = num_points - 1;
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = (ulong)uVar7;
    }
    uVar3 = 0;
    while (uVar9 = uVar3, uVar9 != uVar8) {
      iVar1 = scaling_points[uVar9 + 1][1];
      iVar2 = scaling_points[uVar9][1];
      uVar5 = scaling_points[uVar9 + 1][0] - scaling_points[uVar9][0];
      uVar6 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar6 = 0;
      }
      lVar4 = 0x8000;
      for (uVar10 = 0; uVar3 = uVar9 + 1, uVar6 != uVar10; uVar10 = uVar10 + 1) {
        scaling_lut[(long)scaling_points[uVar9][0] + uVar10] =
             (int)((ulong)lVar4 >> 0x10) + scaling_points[uVar9][1];
        lVar4 = lVar4 + ((((int)uVar5 >> 1) + 0x10000) / (int)uVar5) * (iVar1 - iVar2);
      }
    }
    for (lVar4 = (long)scaling_points[(int)uVar7][0]; lVar4 < 0x100; lVar4 = lVar4 + 1) {
      scaling_lut[lVar4] = scaling_points[(int)uVar7][1];
    }
  }
  return;
}

Assistant:

static void init_scaling_function(const int scaling_points[][2], int num_points,
                                  int scaling_lut[]) {
  if (num_points == 0) return;

  for (int i = 0; i < scaling_points[0][0]; i++)
    scaling_lut[i] = scaling_points[0][1];

  for (int point = 0; point < num_points - 1; point++) {
    int delta_y = scaling_points[point + 1][1] - scaling_points[point][1];
    int delta_x = scaling_points[point + 1][0] - scaling_points[point][0];

    int64_t delta = delta_y * ((65536 + (delta_x >> 1)) / delta_x);

    for (int x = 0; x < delta_x; x++) {
      scaling_lut[scaling_points[point][0] + x] =
          scaling_points[point][1] + (int)((x * delta + 32768) >> 16);
    }
  }

  for (int i = scaling_points[num_points - 1][0]; i < 256; i++)
    scaling_lut[i] = scaling_points[num_points - 1][1];
}